

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter_gui.c
# Opt level: O2

char * str_escape(char *s,int size)

{
  ulong uVar1;
  char *pcVar2;
  
  if (s != (char *)0x0) {
    uVar1 = (ulong)(uint)size;
    if (size < 1) {
      uVar1 = strlen(s);
    }
    if (s_esclength <= uVar1 * 2) {
      freebytes(s_escbuffer,s_esclength);
      s_esclength = (uVar1 * 2 & 0xffffffffffffe000) + 0x2000;
      s_escbuffer = (char *)getbytes(s_esclength);
    }
    if (s_escbuffer != (char *)0x0) {
      pcVar2 = pdgui_strnescape(s_escbuffer,s_esclength,s,(long)size);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

static const char* str_escape(const char*s, int size)
{
    if(!s)
        return s;
    if (!get_escapebuffer(s, size))
        return 0;
    return pdgui_strnescape(s_escbuffer, s_esclength, s, size);
}